

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestDocsSamples.cpp
# Opt level: O2

void DOCTEST_ANON_FUNC_9(void)

{
  code *pcVar1;
  char extraout_AL;
  char *in_RDX;
  double __x;
  ExpressionDecomposer local_f0;
  int local_ec;
  Result local_e8;
  string result;
  Expression_lhs<unsigned_long> local_a8;
  ResultBuilder DOCTEST_RB;
  
  ApprovalTests::SystemUtils::safeGetEnv_abi_cxx11_
            (&result,(SystemUtils *)"THIS_ENVIRONMENT_VARIABLE_SHOULD_NOT_EXIST",in_RDX);
  doctest::String::String((String *)&local_e8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/SystemUtilsTests.cpp"
             ,0x26,"result.length() == 0","",(String *)&local_e8);
  doctest::String::~String((String *)&local_e8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_f0,DT_REQUIRE);
  local_a8.lhs = result._M_string_length;
  local_a8.m_at = local_f0.m_at;
  local_ec = 0;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_e8,&local_a8,&local_ec);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

explicit Greeting() : nationality(British)
    {
    }